

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileColliderTests.cpp
# Opt level: O0

void __thiscall
solitaire::colliders::StockPileColliderTests_thirteenUncoveredCardsCollidesWith_Test::
StockPileColliderTests_thirteenUncoveredCardsCollidesWith_Test
          (StockPileColliderTests_thirteenUncoveredCardsCollidesWith_Test *this)

{
  StockPileColliderTests_thirteenUncoveredCardsCollidesWith_Test *this_local;
  
  StockPileColliderTests::StockPileColliderTests(&this->super_StockPileColliderTests);
  (this->super_StockPileColliderTests).super_Test._vptr_Test =
       (_func_int **)&PTR__StockPileColliderTests_thirteenUncoveredCardsCollidesWith_Test_004fe4d8;
  return;
}

Assistant:

TEST_F(StockPileColliderTests, thirteenUncoveredCardsCollidesWith) {
    EXPECT_CALL(stockPileMock, getSelectedCardIndex())
        .WillRepeatedly(Return(12));

    EXPECT_FALSE(collider.uncoveredCardsCollidesWith(
        pileUncoveredCardsPosition + Position {pileCardsSpacing * 2 - 1, 0}));
    EXPECT_FALSE(collider.uncoveredCardsCollidesWith(
        pileUncoveredCardsPosition + Position {pileCardsSpacing * 2, -1}));
    EXPECT_FALSE(collider.uncoveredCardsCollidesWith(
        pileUncoveredCardsBottomRightCorner + Position {pileCardsSpacing * 2 + 1, 0}));
    EXPECT_FALSE(collider.uncoveredCardsCollidesWith(
        pileUncoveredCardsBottomRightCorner + Position {pileCardsSpacing * 2, 1}));
    EXPECT_TRUE(collider.uncoveredCardsCollidesWith(
        pileUncoveredCardsPosition + Position {pileCardsSpacing * 2, 0}));
    EXPECT_TRUE(collider.uncoveredCardsCollidesWith(
        pileUncoveredCardsBottomRightCorner + Position {pileCardsSpacing * 2, 0}));
}